

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cc
# Opt level: O0

void yyrestart(FILE *input_file)

{
  YY_BUFFER_STATE pyVar1;
  YY_BUFFER_STATE local_20;
  YY_BUFFER_STATE local_18;
  FILE *input_file_local;
  
  if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
    local_18 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_18 = yy_buffer_stack[yy_buffer_stack_top];
  }
  if (local_18 == (YY_BUFFER_STATE)0x0) {
    yyensure_buffer_stack();
    pyVar1 = yy_create_buffer(yyin,0x4000);
    yy_buffer_stack[yy_buffer_stack_top] = pyVar1;
  }
  if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
    local_20 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_20 = yy_buffer_stack[yy_buffer_stack_top];
  }
  yy_init_buffer(local_20,input_file);
  yy_load_buffer_state();
  return;
}

Assistant:

void yyrestart  (FILE * input_file )
{
    
	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack ();
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE );
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file );
	yy_load_buffer_state(  );
}